

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxflow.c
# Opt level: O0

void flow_network_create(FlowNetwork *network,int32_t nnodes)

{
  flow_t *pfVar1;
  int32_t nsquared;
  int32_t nnodes_local;
  FlowNetwork *network_local;
  
  if (network->nnodes != 0) {
    flow_network_destroy(network);
  }
  network->nnodes = nnodes;
  pfVar1 = (flow_t *)calloc((long)(nnodes * nnodes),4);
  network->caps = pfVar1;
  if (network->caps == (flow_t *)0x0) {
    flow_network_destroy(network);
  }
  return;
}

Assistant:

void flow_network_create(FlowNetwork *network, int32_t nnodes) {
    if (network->nnodes) {
        flow_network_destroy(network);
    }
    network->nnodes = nnodes;
    int32_t nsquared = nnodes * nnodes;
    network->caps = calloc(nsquared, sizeof(*network->caps));

    if (!network->caps) {
        flow_network_destroy(network);
    }
}